

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long mkvparser::VideoTrack::Parse
               (Segment *pSegment,Info *info,longlong element_start,longlong element_size,
               VideoTrack **pResult)

{
  IMkvReader *reader;
  Segment *pSegment_00;
  pointer pCVar1;
  pointer pcVar2;
  pointer pPVar3;
  long *in_RSI;
  long *in_R8;
  int status;
  VideoTrack *pTrack;
  long status_3;
  char *colour_space;
  Projection *projection;
  Colour *colour;
  long status_2;
  long status_1;
  longlong size;
  longlong id;
  unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> projection_ptr;
  unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> colour_ptr;
  longlong stop;
  longlong pos;
  Settings *s;
  IMkvReader *pReader;
  unique_ptr<char[],_std::default_delete<char[]>_> colour_space_ptr;
  double rate;
  longlong stereo_mode;
  longlong display_unit;
  longlong display_height;
  longlong display_width;
  longlong height;
  longlong width;
  pointer in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  int iVar4;
  longlong *in_stack_fffffffffffffe98;
  Segment *in_stack_fffffffffffffea0;
  Segment *dst;
  Info *in_stack_fffffffffffffea8;
  undefined6 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 in_stack_fffffffffffffeb7;
  IMkvReader *in_stack_fffffffffffffeb8;
  Segment *in_stack_fffffffffffffec0;
  IMkvReader *in_stack_fffffffffffffec8;
  Projection **in_stack_ffffffffffffff50;
  long in_stack_ffffffffffffff58;
  Colour **in_stack_ffffffffffffff60;
  IMkvReader *in_stack_ffffffffffffff68;
  IMkvReader *colour_start;
  Segment *local_60;
  IMkvReader *local_58;
  longlong local_50;
  longlong local_48;
  IMkvReader *local_40;
  longlong local_38;
  Info *local_8;
  
  if (*in_R8 == 0) {
    if (*in_RSI == 1) {
      local_38 = 0;
      local_40 = (IMkvReader *)0x0;
      local_48 = 0;
      local_50 = 0;
      local_58 = (IMkvReader *)0x0;
      local_60 = (Segment *)0x0;
      std::unique_ptr<char[],std::default_delete<char[]>>::
      unique_ptr<std::default_delete<char[]>,void>
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      reader = (IMkvReader *)in_RSI[0xd];
      colour_start = (IMkvReader *)((long)&reader->_vptr_IMkvReader + in_RSI[0xe]);
      std::unique_ptr<mkvparser::Colour,std::default_delete<mkvparser::Colour>>::
      unique_ptr<std::default_delete<mkvparser::Colour>,void>
                ((unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      std::unique_ptr<mkvparser::Projection,std::default_delete<mkvparser::Projection>>::
      unique_ptr<std::default_delete<mkvparser::Projection>,void>
                ((unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      do {
        if ((long)colour_start <= (long)reader) {
          if (reader == colour_start) {
            pSegment_00 = (Segment *)operator_new(0x110,(nothrow_t *)&std::nothrow);
            dst = (Segment *)0x0;
            if (pSegment_00 != (Segment *)0x0) {
              VideoTrack((VideoTrack *)0x0,pSegment_00,
                         CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                         (longlong)in_stack_fffffffffffffe88);
              dst = pSegment_00;
            }
            in_stack_fffffffffffffea0 = dst;
            if (dst == (Segment *)0x0) {
              local_8 = (Info *)0xffffffffffffffff;
            }
            else {
              in_stack_fffffffffffffe94 = Track::Info::Copy(in_stack_fffffffffffffea8,(Info *)dst);
              if (in_stack_fffffffffffffe94 == 0) {
                dst->m_clusterSize = local_38;
                dst[1].m_pReader = local_40;
                dst[1].m_element_start = local_48;
                dst[1].m_start = local_50;
                dst[1].m_size = (longlong)local_58;
                dst[1].m_eos.m_pSegment = local_60;
                dst[1].m_eos.m_index = 0;
                pCVar1 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                         ::release((unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                                    *)0x1848cf);
                dst[1].m_eos.m_pos = (longlong)pCVar1;
                pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::release
                                   ((unique_ptr<char[],_std::default_delete<char[]>_> *)0x1848ee);
                dst[1].m_eos.m_element_start = (longlong)pcVar2;
                pPVar3 = std::
                         unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                         ::release((unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                                    *)0x18490d);
                dst[1].m_eos.m_element_size = (longlong)pPVar3;
                *in_R8 = (long)dst;
                local_8 = (Info *)0x0;
              }
              else {
                iVar4 = in_stack_fffffffffffffe94;
                if (dst != (Segment *)0x0) {
                  (*(code *)dst->m_pReader[1]._vptr_IMkvReader)();
                }
                local_8 = (Info *)(long)in_stack_fffffffffffffe94;
                in_stack_fffffffffffffe94 = iVar4;
              }
            }
          }
          else {
            local_8 = (Info *)0xfffffffffffffffe;
          }
          goto LAB_00184949;
        }
        local_8 = (Info *)ParseElementHeader(in_stack_fffffffffffffeb8,
                                             (longlong *)
                                             CONCAT17(in_stack_fffffffffffffeb7,
                                                      CONCAT16(in_stack_fffffffffffffeb6,
                                                               in_stack_fffffffffffffeb0)),
                                             (longlong)in_stack_fffffffffffffea8,
                                             (longlong *)in_stack_fffffffffffffea0,
                                             in_stack_fffffffffffffe98);
        if ((long)local_8 < 0) goto LAB_00184949;
        if (in_stack_ffffffffffffff58 == 0xb0) {
          local_38 = UnserializeUInt(in_stack_fffffffffffffeb8,
                                     CONCAT17(in_stack_fffffffffffffeb7,
                                              CONCAT16(in_stack_fffffffffffffeb6,
                                                       in_stack_fffffffffffffeb0)),
                                     (longlong)in_stack_fffffffffffffea8);
          if (local_38 < 1) {
            local_8 = (Info *)0xfffffffffffffffe;
            goto LAB_00184949;
          }
        }
        else if (in_stack_ffffffffffffff58 == 0xba) {
          local_40 = (IMkvReader *)
                     UnserializeUInt(in_stack_fffffffffffffeb8,
                                     CONCAT17(in_stack_fffffffffffffeb7,
                                              CONCAT16(in_stack_fffffffffffffeb6,
                                                       in_stack_fffffffffffffeb0)),
                                     (longlong)in_stack_fffffffffffffea8);
          if ((long)local_40 < 1) {
            local_8 = (Info *)0xfffffffffffffffe;
            goto LAB_00184949;
          }
        }
        else if (in_stack_ffffffffffffff58 == 0x54b0) {
          local_48 = UnserializeUInt(in_stack_fffffffffffffeb8,
                                     CONCAT17(in_stack_fffffffffffffeb7,
                                              CONCAT16(in_stack_fffffffffffffeb6,
                                                       in_stack_fffffffffffffeb0)),
                                     (longlong)in_stack_fffffffffffffea8);
          if (local_48 < 1) {
            local_8 = (Info *)0xfffffffffffffffe;
            goto LAB_00184949;
          }
        }
        else if (in_stack_ffffffffffffff58 == 0x54ba) {
          local_50 = UnserializeUInt(in_stack_fffffffffffffeb8,
                                     CONCAT17(in_stack_fffffffffffffeb7,
                                              CONCAT16(in_stack_fffffffffffffeb6,
                                                       in_stack_fffffffffffffeb0)),
                                     (longlong)in_stack_fffffffffffffea8);
          if (local_50 < 1) {
            local_8 = (Info *)0xfffffffffffffffe;
            goto LAB_00184949;
          }
        }
        else if (in_stack_ffffffffffffff58 == 0x54b2) {
          in_stack_fffffffffffffec8 =
               (IMkvReader *)
               UnserializeUInt(in_stack_fffffffffffffeb8,
                               CONCAT17(in_stack_fffffffffffffeb7,
                                        CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0
                                                )),(longlong)in_stack_fffffffffffffea8);
          local_58 = in_stack_fffffffffffffec8;
          if ((long)in_stack_fffffffffffffec8 < 0) {
            local_8 = (Info *)0xfffffffffffffffe;
            goto LAB_00184949;
          }
        }
        else if (in_stack_ffffffffffffff58 == 0x53b8) {
          in_stack_fffffffffffffec0 =
               (Segment *)
               UnserializeUInt(in_stack_fffffffffffffeb8,
                               CONCAT17(in_stack_fffffffffffffeb7,
                                        CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0
                                                )),(longlong)in_stack_fffffffffffffea8);
          local_60 = in_stack_fffffffffffffec0;
          if ((long)in_stack_fffffffffffffec0 < 0) {
            local_8 = (Info *)0xfffffffffffffffe;
            goto LAB_00184949;
          }
        }
        else {
          if (in_stack_ffffffffffffff58 == 0x2383e3) {
            local_8 = (Info *)UnserializeFloat(in_stack_fffffffffffffec8,
                                               (longlong)in_stack_fffffffffffffec0,
                                               (longlong)in_stack_fffffffffffffeb8,
                                               (double *)
                                               CONCAT17(in_stack_fffffffffffffeb7,
                                                        CONCAT16(in_stack_fffffffffffffeb6,
                                                                 in_stack_fffffffffffffeb0)));
            if (-1 < (long)local_8) {
              local_8 = (Info *)0xfffffffffffffffe;
            }
            goto LAB_00184949;
          }
          if (in_stack_ffffffffffffff58 == 0x55b0) {
            in_stack_fffffffffffffeb7 =
                 Colour::Parse(reader,(longlong)colour_start,(longlong)in_stack_ffffffffffffff68,
                               in_stack_ffffffffffffff60);
            if (!(bool)in_stack_fffffffffffffeb7) {
              local_8 = (Info *)0xfffffffffffffffe;
              goto LAB_00184949;
            }
            std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::reset
                      ((unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> *)
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       in_stack_fffffffffffffe88);
          }
          else if (in_stack_ffffffffffffff58 == 0x7670) {
            in_stack_fffffffffffffeb6 =
                 Projection::Parse(in_stack_ffffffffffffff68,(longlong)in_stack_ffffffffffffff60,
                                   0x7670,in_stack_ffffffffffffff50);
            if (!(bool)in_stack_fffffffffffffeb6) {
              local_8 = (Info *)0xfffffffffffffffe;
              goto LAB_00184949;
            }
            std::unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::
            reset((unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> *)
                  CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                  (pointer)in_stack_fffffffffffffe88);
          }
          else if (in_stack_ffffffffffffff58 == 0x2eb524) {
            in_stack_fffffffffffffea8 =
                 (Info *)UnserializeString(in_stack_fffffffffffffec8,
                                           (longlong)in_stack_fffffffffffffec0,
                                           (longlong)in_stack_fffffffffffffeb8,
                                           (char **)CONCAT17(in_stack_fffffffffffffeb7,
                                                             CONCAT16(in_stack_fffffffffffffeb6,
                                                                      in_stack_fffffffffffffeb0)));
            local_8 = in_stack_fffffffffffffea8;
            if ((long)in_stack_fffffffffffffea8 < 0) goto LAB_00184949;
            std::unique_ptr<char[],std::default_delete<char[]>>::reset<char*,void>
                      ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       (char *)in_stack_fffffffffffffe88);
          }
        }
        reader = (IMkvReader *)((long)in_stack_ffffffffffffff50 + (long)reader);
      } while ((long)reader <= (long)colour_start);
      local_8 = (Info *)0xfffffffffffffffe;
LAB_00184949:
      std::unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::
      ~unique_ptr((unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> *)
                  CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::~unique_ptr
                ((unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_fffffffffffffea0);
    }
    else {
      local_8 = (Info *)0xffffffffffffffff;
    }
  }
  else {
    local_8 = (Info *)0xffffffffffffffff;
  }
  return (long)local_8;
}

Assistant:

long VideoTrack::Parse(Segment* pSegment, const Info& info,
                       long long element_start, long long element_size,
                       VideoTrack*& pResult) {
  if (pResult)
    return -1;

  if (info.type != Track::kVideo)
    return -1;

  long long width = 0;
  long long height = 0;
  long long display_width = 0;
  long long display_height = 0;
  long long display_unit = 0;
  long long stereo_mode = 0;

  double rate = 0.0;
  std::unique_ptr<char[]> colour_space_ptr;

  IMkvReader* const pReader = pSegment->m_pReader;

  const Settings& s = info.settings;
  assert(s.start >= 0);
  assert(s.size >= 0);

  long long pos = s.start;
  assert(pos >= 0);

  const long long stop = pos + s.size;

  std::unique_ptr<Colour> colour_ptr;
  std::unique_ptr<Projection> projection_ptr;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvPixelWidth) {
      width = UnserializeUInt(pReader, pos, size);

      if (width <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvPixelHeight) {
      height = UnserializeUInt(pReader, pos, size);

      if (height <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayWidth) {
      display_width = UnserializeUInt(pReader, pos, size);

      if (display_width <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayHeight) {
      display_height = UnserializeUInt(pReader, pos, size);

      if (display_height <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayUnit) {
      display_unit = UnserializeUInt(pReader, pos, size);

      if (display_unit < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvStereoMode) {
      stereo_mode = UnserializeUInt(pReader, pos, size);

      if (stereo_mode < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvFrameRate) {
      const long status = UnserializeFloat(pReader, pos, size, rate);

      if (status < 0)
        return status;

      if (rate <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvColour) {
      Colour* colour = NULL;
      if (!Colour::Parse(pReader, pos, size, &colour)) {
        return E_FILE_FORMAT_INVALID;
      } else {
        colour_ptr.reset(colour);
      }
    } else if (id == libwebm::kMkvProjection) {
      Projection* projection = NULL;
      if (!Projection::Parse(pReader, pos, size, &projection)) {
        return E_FILE_FORMAT_INVALID;
      } else {
        projection_ptr.reset(projection);
      }
    } else if (id == libwebm::kMkvColourSpace) {
      char* colour_space = NULL;
      const long status = UnserializeString(pReader, pos, size, colour_space);
      if (status < 0)
        return status;
      colour_space_ptr.reset(colour_space);
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  VideoTrack* const pTrack =
      new (std::nothrow) VideoTrack(pSegment, element_start, element_size);

  if (pTrack == NULL)
    return -1;  // generic error

  const int status = info.Copy(pTrack->m_info);

  if (status) {  // error
    delete pTrack;
    return status;
  }

  pTrack->m_width = width;
  pTrack->m_height = height;
  pTrack->m_display_width = display_width;
  pTrack->m_display_height = display_height;
  pTrack->m_display_unit = display_unit;
  pTrack->m_stereo_mode = stereo_mode;
  pTrack->m_rate = rate;
  pTrack->m_colour = colour_ptr.release();
  pTrack->m_colour_space = colour_space_ptr.release();
  pTrack->m_projection = projection_ptr.release();

  pResult = pTrack;
  return 0;  // success
}